

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

LPSTR CharNextA(LPCSTR lpsz)

{
  LPSTR pCVar1;
  DWORD in_EDX;
  
  if (PAL_InitializeChakraCoreCalled) {
    pCVar1 = CharNextExA(0xfde9,lpsz,in_EDX);
    if (PAL_InitializeChakraCoreCalled != false) {
      return pCVar1;
    }
  }
  abort();
}

Assistant:

LPSTR
PALAPI
CharNextA(
  IN LPCSTR lpsz)
{
    LPSTR pRet;
    PERF_ENTRY(CharNextA);
    ENTRY("CharNextA (lpsz=%p (%s))\n", lpsz?lpsz:NULL, lpsz?lpsz:NULL);

    pRet = CharNextExA(GetACP(), lpsz, 0);

    LOGEXIT ("CharNextA returns LPSTR %p\n", pRet);
    PERF_EXIT(CharNextA);
    return pRet;
}